

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void Am_Put_Objects_Back_In_Place
               (Am_Object *group,Am_Value_List *objects,Am_Value_List *places,bool add_part)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  Am_Value *pAVar4;
  Am_Slot_Key key;
  Am_Object *object_00;
  Am_Object place;
  Am_Object object;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object *local_40;
  Am_Object local_38;
  
  local_40 = group;
  uVar2 = Am_Value_List::Length(objects);
  uVar3 = Am_Value_List::Length(places);
  if (uVar2 != uVar3) {
    Am_Error("** Lists not the same length in put_back");
  }
  local_70.data = (Am_Object_Data *)0x0;
  local_80.data = (Am_Object_Data *)0x0;
  Am_Value_List::End(objects);
  Am_Value_List::End(places);
  while (bVar1 = Am_Value_List::First(objects), !bVar1) {
    pAVar4 = Am_Value_List::Get(objects);
    Am_Object::operator=(&local_70,pAVar4);
    pAVar4 = Am_Value_List::Get(places);
    Am_Object::operator=(&local_80,pAVar4);
    key = (Am_Slot_Key)&local_70;
    if (add_part) {
      Am_Object::Get_Object(&local_48,key,10);
      bVar1 = Am_Object::Valid(&local_48);
      bVar1 = !bVar1;
      Am_Object::~Am_Object(&local_48);
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
      Am_Object::Am_Object(&local_50,&local_70);
      Am_Object::Add_Part(local_40,&local_50,true,0);
      Am_Object::~Am_Object(&local_50);
    }
    bVar1 = Am_Object::Valid(&local_80);
    if (bVar1) {
      Am_Object::Get_Object(&local_78,(Am_Slot_Key)&local_80,10);
      Am_Object::Get_Object(&local_58,key,10);
      bVar1 = Am_Object::operator==(&local_78,&local_58);
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_78);
    }
    else {
      bVar1 = false;
    }
    if (bVar1 == false) {
      Am_Object::Am_Object(&local_68,&local_70);
      object_00 = &local_68;
      Am_To_Top(object_00);
    }
    else {
      Am_Object::Am_Object(&local_60,&local_70);
      Am_Object::Am_Object(&local_38,&local_80);
      object_00 = &local_60;
      Am_Move_Object(object_00,&local_38,false);
      Am_Object::~Am_Object(&local_38);
    }
    Am_Object::~Am_Object(object_00);
    Am_Value_List::Prev(objects);
    Am_Value_List::Prev(places);
  }
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_70);
  return;
}

Assistant:

void
Am_Put_Objects_Back_In_Place(Am_Object group, Am_Value_List objects,
                             Am_Value_List places, bool add_part)
{
  //std::cout << "Put objects back into group " << group << " objects " << objects
  // << " places " << places <<std::endl <<std::flush;
  if (objects.Length() != places.Length())
    Am_Error("** Lists not the same length in put_back");
  //go through the lists backwards
  Am_Object object, place;
  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ Adding parts " << objects << " to " << group);
  for (objects.End(), places.End(); !objects.First();
       objects.Prev(), places.Prev()) {
    object = objects.Get();
    place = places.Get();
    if (add_part && !object.Get_Owner().Valid())
      group.Add_Part(object);
    if (place.Valid() && place.Get_Owner() == object.Get_Owner())
      Am_Move_Object(object, place, false); //put object before place
    else
      Am_To_Top(object);
  }
}